

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

Validity * __thiscall
kj::TestRunner::setBenchmarkIters(Validity *__return_storage_ptr__,TestRunner *this,StringPtr param)

{
  StringPtr local_30;
  char *local_20;
  size_t local_18;
  
  local_18 = param.content.size_;
  local_20 = param.content.ptr;
  StringPtr::tryParseAs<unsigned_long>(&local_30);
  if ((char)local_30.content.ptr == '\x01') {
    (anonymous_namespace)::benchmarkIterCount = local_30.content.size_;
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  else {
    MainBuilder::Validity::Validity(__return_storage_ptr__,"expected an integer");
  }
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setBenchmarkIters(StringPtr param) {
    KJ_IF_SOME(i, param.tryParseAs<size_t>()) {
      benchmarkIterCount = i;
      return true;
    } else {
      return "expected an integer";
    }